

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lib.c
# Opt level: O0

void find_ameth(char *name,void *data)

{
  int iVar1;
  long *in_RSI;
  char *in_RDI;
  EVP_KEYMGMT *unaff_retaddr;
  int in_stack_0000000c;
  char **str;
  EVP_PKEY *in_stack_00000028;
  
  ERR_set_mark();
  strlen(in_RDI);
  iVar1 = pkey_set_type(in_stack_00000028,(ENGINE *)name,data._4_4_,(char *)str,in_stack_0000000c,
                        unaff_retaddr);
  if (iVar1 != 0) {
    if (*in_RSI == 0) {
      *in_RSI = (long)in_RDI;
    }
    else if (in_RSI[1] == 0) {
      in_RSI[1] = (long)in_RDI;
    }
  }
  ERR_pop_to_mark();
  return;
}

Assistant:

static void find_ameth(const char *name, void *data)
{
    const char **str = data;

    /*
     * The error messages from pkey_set_type() are uninteresting here,
     * and misleading.
     */
    ERR_set_mark();

    if (pkey_set_type(NULL, NULL, EVP_PKEY_NONE, name, strlen(name),
                      NULL)) {
        if (str[0] == NULL)
            str[0] = name;
        else if (str[1] == NULL)
            str[1] = name;
    }

    ERR_pop_to_mark();
}